

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directed_Energy_Fire_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Directed_Energy_Fire_PDU::Encode(Directed_Energy_Fire_PDU *this,KDataStream *stream)

{
  bool bVar1;
  KDataStream *pKVar2;
  reference this_00;
  StandardVariable *pSVar3;
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>_>
  local_28;
  const_iterator citrEnd;
  const_iterator citr;
  KDataStream *stream_local;
  Directed_Energy_Fire_PDU *this_local;
  
  Header7::Encode(&this->super_Header,stream);
  pKVar2 = DATA_TYPE::operator<<(stream,(DataTypeBase *)&this->m_FiringEntityID);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,(DataTypeBase *)&this->m_EventID);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_MunTyp).super_DataTypeBase);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_ShotStartTime).super_DataTypeBase);
  pKVar2 = KDataStream::operator<<(pKVar2,(float)this->m_f32CumulativeShotTime);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_EmitterLoc).super_DataTypeBase);
  pKVar2 = KDataStream::operator<<(pKVar2,(float)this->m_f32AperDiameter);
  pKVar2 = KDataStream::operator<<(pKVar2,(float)this->m_f32Wavelength);
  pKVar2 = KDataStream::operator<<(pKVar2,(float)this->m_f32PeakIrradiance);
  pKVar2 = KDataStream::operator<<(pKVar2,(float)this->m_f32PulseRepFreq);
  pKVar2 = KDataStream::operator<<(pKVar2,(float)this->m_f32PulseWidth);
  pKVar2 = KDataStream::operator<<(pKVar2,(this->m_DeUnion).m_ui16Flags);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8PulseShp);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8Padding1);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui32Padding2);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui16Padding3);
  KDataStream::operator<<(pKVar2,this->m_ui16NumDERecs);
  citrEnd = std::
            vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
            ::begin(&this->m_vDeRec);
  local_28._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
       ::end(&this->m_vDeRec);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_28);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>_>
              ::operator*(&citrEnd);
    pSVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>::operator->(this_00);
    (*(pSVar3->super_DataTypeBase)._vptr_DataTypeBase[5])(pSVar3,stream);
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>_>
    ::operator++(&citrEnd);
  }
  return;
}

Assistant:

void Directed_Energy_Fire_PDU::Encode( KDataStream & stream ) const
{
    Header::Encode( stream );

    stream << KDIS_STREAM m_FiringEntityID
           << KDIS_STREAM m_EventID
           << KDIS_STREAM m_MunTyp
           << KDIS_STREAM m_ShotStartTime
           << m_f32CumulativeShotTime
           << KDIS_STREAM m_EmitterLoc
           << m_f32AperDiameter
           << m_f32Wavelength
           << m_f32PeakIrradiance
           << m_f32PulseRepFreq
           << m_f32PulseWidth
           << m_DeUnion.m_ui16Flags
           << m_ui8PulseShp
           << m_ui8Padding1
           << m_ui32Padding2
           << m_ui16Padding3
           << m_ui16NumDERecs;

    vector<StdVarPtr>::const_iterator citr = m_vDeRec.begin();
    vector<StdVarPtr>::const_iterator citrEnd = m_vDeRec.end();
    for( ; citr != citrEnd; ++citr )
    {
        ( *citr )->Encode( stream );
    }
}